

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# misc.cc
# Opt level: O2

void gutil::split(vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *list,string *s,char delim,bool skip_empty)

{
  istream *piVar1;
  string elem;
  stringstream in;
  
  std::__cxx11::stringstream::stringstream((stringstream *)&in,(string *)s,_S_out|_S_in);
  elem._M_dataplus._M_p = (pointer)&elem.field_2;
  elem._M_string_length = 0;
  elem.field_2._M_local_buf[0] = '\0';
  while( true ) {
    piVar1 = std::getline<char,std::char_traits<char>,std::allocator<char>>
                       ((istream *)&in,(string *)&elem,delim);
    if (((byte)piVar1[*(long *)(*(long *)piVar1 + -0x18) + 0x20] & 5) != 0) break;
    if ((!skip_empty) || (elem._M_string_length != 0)) {
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back(list,&elem);
    }
  }
  std::__cxx11::string::~string((string *)&elem);
  std::__cxx11::stringstream::~stringstream((stringstream *)&in);
  return;
}

Assistant:

void gutil::split(std::vector<std::string> &list, const std::string &s, char delim, bool skip_empty)
{
  std::stringstream in(s);
  std::string elem;

  while (getline(in, elem, delim))
  {
    if (!skip_empty || elem.size() > 0)
    {
      list.push_back(elem);
    }
  }
}